

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void negatecondition(FuncState *fs,expdesc *e)

{
  Instruction *pIVar1;
  Instruction *pc;
  expdesc *e_local;
  FuncState *fs_local;
  
  pIVar1 = getjumpcontrol(fs,(e->u).info);
  if ((((luaP_opmodes[*pIVar1 & 0xff] & 0x80) != 0) && ((*pIVar1 & 0xff) != 0x23)) &&
     ((*pIVar1 & 0xff) != 0x22)) {
    *(byte *)((long)pIVar1 + 1) = ((*pIVar1 >> 8 & 0x7f) != 0 ^ 0xffU) & 1;
    if ((ravi_parser_debug & 2U) != 0) {
      raviY_printf(fs,"[%d]* %o ; set A to %d\n",(ulong)(uint)(e->u).info,(ulong)*pIVar1,
                   (ulong)(*pIVar1 >> 8 & 0x7f));
    }
    return;
  }
  __assert_fail("(luaP_opmodes[((OpCode)(((*pc)&0xff)))] & (1 << 7)) && ((OpCode)(((*pc)&0xff))) != OP_TESTSET && ((OpCode)(((*pc)&0xff))) != OP_TEST"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                ,0x456,"void negatecondition(FuncState *, expdesc *)");
}

Assistant:

static void negatecondition (FuncState *fs, expdesc *e) {
  Instruction *pc = getjumpcontrol(fs, e->u.info);
  lua_assert(testTMode(GET_OPCODE(*pc)) && GET_OPCODE(*pc) != OP_TESTSET &&
                                           GET_OPCODE(*pc) != OP_TEST);
  SETARG_A(*pc, !(GETARG_A(*pc)));
  DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set A to %d\n", e->u.info, *pc, GETARG_A(*pc)));
}